

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * __thiscall
helics::CommonCore::getExtractionType_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  byte bVar1;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *puVar2;
  string *psVar3;
  
  puVar2 = getHandleInfo(this,handle);
  psVar3 = (string *)&gEmptyString_abi_cxx11_;
  if (puVar2 != (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)0x0)
  {
    bVar1 = *(byte *)((long)&puVar2[1]._M_t.
                             super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
                             .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl + 4)
    ;
    if (bVar1 < 0x69) {
      if (bVar1 != 0x65) {
        if (bVar1 != 0x66) {
          return (string *)&gEmptyString_abi_cxx11_;
        }
        return (string *)
               puVar2[0xf]._M_t.
               super___uniq_ptr_impl<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
               ._M_t.
               super__Tuple_impl<0UL,_helics::BrokerObject_*,_std::default_delete<helics::BrokerObject>_>
               .super__Head_base<0UL,_helics::BrokerObject_*,_false>._M_head_impl;
      }
    }
    else if ((bVar1 != 0x70) && (bVar1 != 0x69)) {
      return (string *)&gEmptyString_abi_cxx11_;
    }
    psVar3 = (string *)(puVar2 + 6);
  }
  return psVar3;
}

Assistant:

const std::string& CommonCore::getExtractionType(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::PUBLICATION:
            case InterfaceType::INPUT:
            case InterfaceType::ENDPOINT:
                return handleInfo->type;
            case InterfaceType::FILTER:
                return handleInfo->type_out;
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}